

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O3

int __thiscall SSD1306::OledI2C::init(OledI2C *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  
  sendCommand(this,0x8d,'\x14');
  sendCommand(this,' ','\x02');
  sendCommand(this,0xd5,0x80);
  sendCommand(this,0xd3,'\0');
  sendCommand(this,'@');
  sendCommand(this,0xa1);
  sendCommand(this,200);
  sendCommand(this,0xda,'\x12');
  sendCommand(this,0xd9,0xf1);
  sendCommand(this,0xdb,'@');
  sendCommand(this,0xa4);
  sendCommand(this,0xa6);
  sendCommand(this,'!','\0','\x7f');
  sendCommand(this,'\"','\0','\a');
  sendCommand(this,0x81,'\x7f');
  sendCommand(this,0xaf);
  iVar1 = usleep(100000);
  return iVar1;
}

Assistant:

void
SSD1306::OledI2C::init() const
{
    // Enable charge pump regulator - 8Dh, 14h

    sendCommand(OLED_ENABLE_CHARGE_PUMP_REGULATOR, 0x14);

    // Set Memory Addressing Mode - 20h, 00h

    sendCommand(OLED_SET_MEMORY_ADDRESSING_MODE, OLED_PAGE_ADDRESSING_MODE);

    // Set Osc Frequency D5h, 80h

    sendCommand(OLED_SET_OSC_FREQUENCY, 0x80);

    // Set Display Offset - D3h, 00h

    sendCommand(OLED_SET_DISPLAY_OFFSET, 0x00);

    // Set Display Start Line - 40h

    sendCommand(OLED_SET_DISPLAY_START_LINE_MASK | 0x00);

    // Set Segment re-map - A0h/A1h

    sendCommand(OLED_SET_SEGMENT_REMAP_127);

    // Set COM Output Scan Direction - C0, C8h

    sendCommand(OLED_SET_COM_OUTPUT_SCAN_DIRECTION_REMAP);

    // Set COM Pins hardware configuration - DAh, 12h

    sendCommand(OLED_SET_COM_PINS_HARDWARE_CONFIGURATION, 0x12);

    // Set Pre-charge Period D9h, F1h

    sendCommand(OLED_SET_PRECHARGE_PERIOD, 0xF1);

    // Set Vcomh Deselect Level - DBh, 40h

    sendCommand(OLED_SET_VCOMH_DESELECT_LEVEL, 0x40);

    // Disable Entire Display On - A4h

    sendCommand(OLED_SET_ENTIRE_DISPLAY_ON_RESUME);

    // Set Normal Display - A6h

    sendCommand(OLED_SET_NORMAL_DISPLAY);

    // Set Column Address - 21h, 00h, 7Fh

    sendCommand(OLED_SET_COLUMN_ADDRESS, 0x00, 0x7F);

    // Set Page Address - 22h, 00h, 07h

    sendCommand(OLED_SET_PAGE_ADDRESS, 0x00, 0x07);

    // Set Contrast Control - 81h, 7Fh

    sendCommand(OLED_SET_CONTRAST, 0x7F);

    // Display On - AFh

    sendCommand(OLED_SET_DISPLAY_ON);

    usleep(100000);
}